

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintUInt32
          (FastFieldValuePrinter *this,uint32_t val,BaseTextGenerator *generator)

{
  AlphaNum *a;
  AlphaNum local_80;
  string local_50;
  string_view local_30;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  FastFieldValuePrinter *pFStack_10;
  uint32_t val_local;
  FastFieldValuePrinter *this_local;
  
  local_20 = generator;
  generator_local._4_4_ = val;
  pFStack_10 = this;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_80,val);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_50,(lts_20250127 *)&local_80,a);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  BaseTextGenerator::PrintString(generator,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintUInt32(
    uint32_t val, BaseTextGenerator* generator) const {
  generator->PrintString(absl::StrCat(val));
}